

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

PNode * commit_tree(Parser *p,PNode *pn)

{
  uint32 *puVar1;
  VecPNode *v;
  int iVar2;
  uint uVar3;
  D_ReductionCode p_Var4;
  bool bVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  D_ParseNode *pDVar10;
  PNode *pPVar11;
  PNode **ppPVar12;
  uint uVar13;
  long lVar14;
  PNode *pPVar15;
  PNode *pn_00;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  PNode *_t;
  PNode *pPVar19;
  int iVar20;
  PNode *_t_1;
  bool bVar21;
  uint local_70 [2];
  D_ParseNode **local_68;
  D_ParseNode *local_60 [3];
  ulong local_48;
  PNode **local_40;
  PNode *local_38;
  
  pPVar19 = pn->latest;
  pPVar11 = pPVar19->latest;
  pPVar15 = pPVar19;
  if (pPVar19 != pPVar19->latest) {
    do {
      pPVar19 = pPVar11;
      pPVar19->refcount = pPVar19->refcount + 1;
      puVar1 = &pPVar15->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_PNode(p,pPVar15);
      }
      pn->latest = pPVar19;
      pPVar11 = pPVar19->latest;
      pPVar15 = pPVar19;
    } while (pPVar19 != pPVar19->latest);
  }
  if (pPVar19->evaluated != '\0') {
    return pPVar19;
  }
  if ((pPVar19->parse_node).start_loc.s == (pPVar19->parse_node).end) {
    if ((pPVar19->reduction == (D_Reduction *)0x0) ||
       (pPVar19->reduction->final_code == (D_ReductionCode)0x0)) {
      pPVar19->evaluated = '\x01';
    }
    pPVar11 = pPVar19->ambiguities;
    if (pPVar11 == (PNode *)0x0) goto LAB_0014612c;
    iVar7 = final_actionless(pPVar19);
    bVar21 = iVar7 != 0;
  }
  else {
    pPVar19->evaluated = '\x01';
    pPVar11 = pPVar19->ambiguities;
    if (pPVar11 == (PNode *)0x0) goto LAB_0014612c;
    bVar21 = false;
  }
  local_60[0] = &pPVar19->parse_node;
  local_68 = local_60;
  local_70[0] = 1;
  do {
    pPVar19 = pPVar11->latest;
    pPVar15 = pPVar19->latest;
    pn_00 = pPVar19;
    if (pPVar19 != pPVar19->latest) {
      do {
        pPVar19 = pPVar15;
        pPVar19->refcount = pPVar19->refcount + 1;
        puVar1 = &pn_00->refcount;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          free_PNode(p,pn_00);
        }
        pPVar11->latest = pPVar19;
        pPVar15 = pPVar19->latest;
        pn_00 = pPVar19;
      } while (pPVar19 != pPVar19->latest);
    }
    if (((!(bool)((p->user).dont_merge_epsilon_trees == 0 & bVar21)) ||
        ((pPVar19->parse_node).start_loc.s != (pPVar19->parse_node).end)) ||
       (iVar7 = final_actionless(pPVar19), iVar7 == 0)) {
      uVar9 = (ulong)local_70[0];
      if (uVar9 == 0) {
        if (local_68 != (D_ParseNode **)0x0) {
          if (local_68 == local_60) goto LAB_001460c4;
          goto LAB_00146079;
        }
        local_60[0] = &pPVar19->parse_node;
        local_68 = local_60;
        local_70[0] = 1;
      }
      else {
        uVar16 = 0;
        bVar5 = false;
        do {
          if (local_68[uVar16] == &pPVar19->parse_node) {
            bVar5 = true;
          }
          uVar16 = uVar16 + 1;
        } while (uVar9 != uVar16);
        if (!bVar5) {
          if (local_68 == local_60) {
            if (local_70[0] < 3) goto LAB_001460c4;
          }
          else if ((local_70[0] & 7) != 0) {
LAB_001460c4:
            local_70[0] = local_70[0] + 1;
            local_68[uVar9] = &pPVar19->parse_node;
            goto LAB_001460cf;
          }
LAB_00146079:
          vec_add_internal(local_70,&pPVar19->parse_node);
        }
      }
    }
LAB_001460cf:
    pPVar11 = pPVar19->ambiguities;
  } while (pPVar11 != (PNode *)0x0);
  if (local_70[0] == 1) {
    pDVar10 = *local_68;
  }
  else {
    pDVar10 = (*(p->user).ambiguity_fn)(&p->user,local_70[0],local_68);
  }
  if (local_68 != local_60 && local_68 != (D_ParseNode **)0x0) {
    free(local_68);
  }
  if (pDVar10 == (D_ParseNode *)0x0) {
    return (PNode *)0x0;
  }
  pPVar19 = (PNode *)(pDVar10 + -2);
LAB_0014612c:
  uVar8 = p->t->symbols[(pPVar19->parse_node).symbol].kind & 0xfffffffe;
  iVar7 = (p->user).dont_fixup_internal_productions;
  if ((pPVar19->children).n == 0) {
    uVar13 = 0;
  }
  else {
    v = &pPVar19->children;
    iVar2 = (p->user).fixup_EBNF_productions;
    local_40 = (pPVar19->children).e;
    uVar17 = 0;
    do {
      pPVar11 = commit_tree(p,(pPVar19->children).v[uVar17]);
      if (pPVar11 == (PNode *)0x0) {
        return (PNode *)0x0;
      }
      ppPVar12 = (pPVar19->children).v;
      pPVar15 = ppPVar12[uVar17];
      if (pPVar11 != pPVar15) {
        pPVar11->refcount = pPVar11->refcount + 1;
        puVar1 = &pPVar15->refcount;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          free_PNode(p,pPVar15);
          ppPVar12 = (pPVar19->children).v;
        }
        ppPVar12[uVar17] = pPVar11;
      }
      if (uVar8 == 2 && iVar7 == 0) {
        ppPVar12 = (pPVar19->children).v;
        uVar13 = p->t->symbols[(ppPVar12[uVar17]->parse_node).symbol].kind;
        if (iVar2 != 0) {
          uVar13 = uVar13 & 0xfffffffe;
        }
        if (uVar13 == 2) {
          lVar14 = (long)(int)uVar17;
          pPVar11 = ppPVar12[lVar14];
          local_48 = (ulong)(pPVar11->children).n;
          uVar3 = (pPVar19->children).n;
          lVar18 = (long)(int)uVar3;
          if (pPVar11 == pPVar19) {
            d_fail("circular parse: unable to fixup internal symbol");
          }
          if (local_48 == 1) {
            pPVar15 = *(pPVar11->children).v;
            puVar1 = &pPVar15->refcount;
            *puVar1 = *puVar1 + 1;
            (pPVar19->children).v[lVar14] = pPVar15;
          }
          else {
            iVar20 = (int)local_48;
            if (iVar20 == 0) {
              if ((int)uVar17 < (int)(lVar18 + -1)) {
                do {
                  ppPVar12 = (pPVar19->children).v;
                  ppPVar12[lVar14] = ppPVar12[lVar14 + 1];
                  lVar14 = lVar14 + 1;
                } while (lVar18 + -1 != lVar14);
              }
              v->n = v->n - 1;
            }
            else {
              uVar9 = local_48;
              local_38 = pPVar11;
              if (1 < iVar20) {
                iVar20 = iVar20 + -1;
                do {
                  ppPVar12 = (pPVar19->children).v;
                  if (ppPVar12 == (PNode **)0x0) {
                    (pPVar19->children).v = local_40;
                    uVar13 = (pPVar19->children).n;
                    (pPVar19->children).n = uVar13 + 1;
                    (pPVar19->children).e[uVar13] = (PNode *)0x0;
                  }
                  else {
                    uVar13 = v->n;
                    if (ppPVar12 == local_40) {
                      if (2 < uVar13) goto LAB_001462e0;
                    }
                    else if ((uVar13 & 7) == 0) {
LAB_001462e0:
                      vec_add_internal(v,(void *)0x0);
                      uVar9 = local_48;
                      goto LAB_001462f1;
                    }
                    v->n = uVar13 + 1;
                    ppPVar12[uVar13] = (PNode *)0x0;
                  }
LAB_001462f1:
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
              }
              if ((int)(uVar17 + 1) < (int)uVar3) {
                iVar20 = (int)uVar9 + uVar3 + -2;
                do {
                  ppPVar12 = (pPVar19->children).v;
                  lVar6 = lVar18 + -1;
                  lVar18 = lVar18 + -1;
                  ppPVar12[iVar20] = ppPVar12[lVar6];
                  iVar20 = iVar20 + -1;
                } while ((int)(uVar17 + 1) < lVar18);
              }
              pPVar11 = local_38;
              if (0 < (int)uVar9) {
                uVar16 = 0;
                do {
                  pPVar15 = (local_38->children).v[uVar16];
                  puVar1 = &pPVar15->refcount;
                  *puVar1 = *puVar1 + 1;
                  (pPVar19->children).v[lVar14 + uVar16] = pPVar15;
                  uVar16 = uVar16 + 1;
                } while (uVar9 != uVar16);
              }
            }
          }
          puVar1 = &pPVar11->refcount;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            free_PNode(p,pPVar11);
          }
          uVar17 = uVar17 - 1;
        }
      }
      uVar17 = uVar17 + 1;
      uVar13 = v->n;
    } while (uVar17 < uVar13);
  }
  if ((pPVar19->reduction != (D_Reduction *)0x0) &&
     (p_Var4 = pPVar19->reduction->final_code, p_Var4 != (D_ReductionCode)0x0)) {
    (*p_Var4)(pPVar19,(pPVar19->children).v,uVar13,0x90,&p->user);
  }
  if (((pPVar19->evaluated != '\0') && ((p->user).save_parse_tree == 0)) && (uVar8 != 2)) {
    free_ParseTreeBelow(p,pPVar19);
  }
  return pPVar19;
}

Assistant:

static PNode *commit_tree(Parser *p, PNode *pn) {
  uint i, fixup_ebnf = 0, fixup = 0, internal = 0;
  LATEST(p, pn);
  if (pn->evaluated) return pn;
  if (!is_unreduced_epsilon_PNode(pn)) pn->evaluated = 1;
  if (pn->ambiguities) pn = resolve_ambiguities(p, pn);
  if (!pn) return NULL;
  fixup_ebnf = p->user.fixup_EBNF_productions;
  internal = is_symbol_internal_or_EBNF(p, pn);
  fixup = !p->user.dont_fixup_internal_productions && internal;
  for (i = 0; i < pn->children.n; i++) {
    PNode *tpn = commit_tree(p, pn->children.v[i]);
    if (!tpn) return NULL;
    if (tpn != pn->children.v[i]) {
      ref_pn(tpn);
      unref_pn(p, pn->children.v[i]);
      pn->children.v[i] = tpn;
    }
    if (fixup &&
        (fixup_ebnf ? is_symbol_internal_or_EBNF(p, pn->children.v[i]) : is_symbol_internal(p, pn->children.v[i]))) {
      fixup_internal_symbol(p, pn, i);
      i -= 1;
      continue;
    }
  }
  if (pn->reduction) DBG(printf("commit %p (%s)\n", (void *)pn, p->t->symbols[pn->parse_node.symbol].name));
  if (pn->reduction && pn->reduction->final_code) {
    void **v0 = pn->children.v == NULL ?  NULL : (void **)&pn->children.v[0];
    pn->reduction->final_code(pn, v0, pn->children.n, (intptr_t)(sizeof(PNode) - sizeof(D_ParseNode)),
                              (D_Parser *)p);
  }
  if (pn->evaluated) {
    if (!p->user.save_parse_tree && !internal) free_ParseTreeBelow(p, pn);
  }
  return pn;
}